

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O0

Gia_Man_t * Gia_ManMaxiUnfold(Gia_Man_t *p,int nFrames,int fUseVars,Vec_Int_t *vInit)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *p_01;
  bool bVar7;
  uint local_a0;
  uint local_9c;
  int iData;
  int iCtrl;
  int Value;
  int f;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vInit_local;
  int fUseVars_local;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  iVar2 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(fUseVars * 2 * iVar1 + nFrames * iVar2);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  Gia_ManHashAlloc(p_00);
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  Value = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (Value < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _f = Gia_ManCi(p,iVar1 + Value);
      bVar7 = _f != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    Gia_ManAppendCi(p_00);
    Value = Value + 1;
  }
  Value = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (Value < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _f = Gia_ManCi(p,iVar1 + Value);
      bVar7 = _f != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    Gia_ManAppendCi(p_00);
    Value = Value + 1;
  }
  if (vInit != (Vec_Int_t *)0x0) {
    iVar1 = Vec_IntSize(vInit);
    iVar2 = Gia_ManRegNum(p);
    if (iVar1 != iVar2) {
      __assert_fail("!vInit || Vec_IntSize(vInit) == Gia_ManRegNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcMaxi.c"
                    ,0x54,"Gia_Man_t *Gia_ManMaxiUnfold(Gia_Man_t *, int, int, Vec_Int_t *)");
    }
  }
  Value = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (Value < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _f = Gia_ManCi(p,iVar1 + Value);
      bVar7 = _f != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Vec_IntEntry(vInit,Value);
    iVar2 = Gia_ManCiLit(p_00,Value);
    iVar4 = Gia_ManRegNum(p);
    iVar4 = Gia_ManCiLit(p_00,iVar4 + Value);
    if (iVar1 == 0) {
      if (fUseVars == 0) {
        local_9c = 0;
      }
      else {
        local_9c = Gia_ManHashAnd(p_00,iVar2,iVar4);
      }
      _f->Value = local_9c;
    }
    else if (iVar1 == 1) {
      if (fUseVars == 0) {
        local_a0 = 1;
      }
      else {
        iVar1 = Abc_LitNot(iVar2);
        local_a0 = Gia_ManHashOr(p_00,iVar1,iVar4);
      }
      _f->Value = local_a0;
    }
    else if (iVar1 == 2) {
      uVar3 = Gia_ManHashAnd(p_00,iVar2,iVar4);
      _f->Value = uVar3;
    }
    else if (iVar1 == 3) {
      iVar1 = Abc_LitNot(iVar2);
      uVar3 = Gia_ManHashOr(p_00,iVar1,iVar4);
      _f->Value = uVar3;
    }
    else if (iVar1 == 4) {
      _f->Value = 0;
    }
    else {
      if (iVar1 != 5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcMaxi.c"
                      ,0x67,"Gia_Man_t *Gia_ManMaxiUnfold(Gia_Man_t *, int, int, Vec_Int_t *)");
      }
      _f->Value = 1;
    }
    Value = Value + 1;
  }
  for (iCtrl = 0; iCtrl < nFrames; iCtrl = iCtrl + 1) {
    Value = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar7 = false;
      if (Value < iVar1) {
        _f = Gia_ManCi(p,Value);
        bVar7 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar3 = Gia_ManAppendCi(p_00);
      _f->Value = uVar3;
      Value = Value + 1;
    }
    Value = 0;
    while( true ) {
      bVar7 = false;
      if (Value < p->nObjs) {
        _f = Gia_ManObj(p,Value);
        bVar7 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(_f);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(_f);
        iVar2 = Gia_ObjFanin1Copy(_f);
        uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
        _f->Value = uVar3;
      }
      Value = Value + 1;
    }
    Value = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar7 = false;
      if (Value < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        _f = Gia_ManCo(p,iVar1 + Value);
        bVar7 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar3 = Gia_ObjFanin0Copy(_f);
      _f->Value = uVar3;
      Value = Value + 1;
    }
    Value = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar7 = false;
      if (Value < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        _f = Gia_ManCi(p,iVar1 + Value);
        bVar7 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjRoToRi(p,_f);
      _f->Value = pGVar6->Value;
      Value = Value + 1;
    }
  }
  Value = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (Value < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      _f = Gia_ManCo(p,iVar1 + Value);
      bVar7 = _f != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ManAppendCo(p_00,_f->Value);
    _f->Value = uVar3;
    Value = Value + 1;
  }
  p_01 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar1 = Gia_ManPiNum(p_01);
  iVar2 = Gia_ManRegNum(p);
  iVar4 = Gia_ManPiNum(p);
  if (iVar1 != iVar2 * 2 + nFrames * iVar4) {
    __assert_fail("Gia_ManPiNum(pNew) == 2 * Gia_ManRegNum(p) + nFrames * Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcMaxi.c"
                  ,0x78,"Gia_Man_t *Gia_ManMaxiUnfold(Gia_Man_t *, int, int, Vec_Int_t *)");
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManMaxiUnfold( Gia_Man_t * p, int nFrames, int fUseVars, Vec_Int_t * vInit )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, f;
    pNew = Gia_ManStart( fUseVars * 2 * Gia_ManRegNum(p) + nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    // control/data variables
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManAppendCi( pNew );
    // build timeframes
    assert( !vInit || Vec_IntSize(vInit) == Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        int Value = Vec_IntEntry( vInit, i );
        int iCtrl = Gia_ManCiLit( pNew, i );
        int iData = Gia_ManCiLit( pNew, Gia_ManRegNum(p)+i );
        // decide based on Value
        if ( Value == 0 )
            pObj->Value = fUseVars ? Gia_ManHashAnd(pNew, iCtrl, iData) : 0;
        else if ( Value == 1 )
            pObj->Value = fUseVars ? Gia_ManHashOr(pNew, Abc_LitNot(iCtrl), iData) : 1;
        else if ( Value == 2 )
            pObj->Value = Gia_ManHashAnd(pNew, iCtrl, iData);
        else if ( Value == 3 )
            pObj->Value = Gia_ManHashOr(pNew, Abc_LitNot(iCtrl), iData);
        else if ( Value == 4 )
            pObj->Value = 0;
        else if ( Value == 5 )
            pObj->Value = 1;
        else assert( 0 );
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachRo( p, pObj, i )
            pObj->Value = Gia_ObjRoToRi(p, pObj)->Value;
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == 2 * Gia_ManRegNum(p) + nFrames * Gia_ManPiNum(p) );
    return pNew;
}